

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureStore
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd,Uint32 ArrayDim)

{
  _List_node_base *p_Var1;
  const_iterator __position;
  const_iterator cVar2;
  const_iterator cVar3;
  iterator *piVar4;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var5;
  undefined4 in_register_0000000c;
  char (*Args_1) [60];
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos;
  uint uVar6;
  const_iterator __position_00;
  allocator local_2c9;
  TokenListType *local_2c8;
  const_iterator local_2c0;
  iterator *local_2b8;
  string err;
  String local_260;
  ConversionStream *local_240;
  char (*local_238) [60];
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Args_1 = (char (*) [60])CONCAT44(in_register_0000000c,ArrayDim);
  Pos._M_node = Token->_M_node;
  _Var5._M_node = ScopeEnd->_M_node;
  local_2c0._M_node._0_4_ = ArrayDim + 1;
  local_2c8 = &this->m_Tokens;
  uVar6 = 0;
  local_2b8 = Token;
  local_240 = this;
  local_238 = Args_1;
  while( true ) {
    piVar4 = local_2b8;
    p_Var1 = ScopeEnd->_M_node;
    if ((uint)local_2c0._M_node == uVar6) {
      __position._M_node = (_Var5._M_node)->_M_next;
      if ((__position._M_node != p_Var1) &&
         (__position_00._M_node = __position._M_node,
         *(int *)&__position._M_node[1]._M_next == 0x144)) {
        for (; (__position_00._M_node != p_Var1 &&
               (*(int *)&__position_00._M_node[1]._M_next != 0x13e));
            __position_00._M_node = (__position_00._M_node)->_M_next) {
        }
        if (__position_00._M_node != p_Var1) {
          cVar2._M_node = local_2b8->_M_node;
          local_2c0._M_node = _Var5._M_node;
          std::__cxx11::string::string((string *)&local_50,"imageStore",(allocator *)&local_260);
          std::__cxx11::string::string
                    ((string *)&local_70,(char *)piVar4->_M_node[3]._M_prev,&local_2c9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    ((HLSLTokenInfo *)&err,Identifier,&local_50,&local_70,0xffffffffffffffff);
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>(local_2c8,cVar2,(HLSLTokenInfo *)&err);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          cVar2._M_node = piVar4->_M_node;
          std::__cxx11::string::string((string *)&local_90,"(",(allocator *)&local_260);
          std::__cxx11::string::string((string *)&local_b0,"",&local_2c9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    ((HLSLTokenInfo *)&err,OpenParen,&local_90,&local_b0,0xffffffffffffffff);
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>(local_2c8,cVar2,(HLSLTokenInfo *)&err);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::assign((char *)&piVar4->_M_node[3]._M_prev);
          std::__cxx11::string::assign((char *)&Pos._M_node[3]._M_prev);
          *(undefined4 *)&Pos._M_node[1]._M_next = 0x13f;
          std::__cxx11::string::assign((char *)&Pos._M_node[1]._M_prev);
          cVar2._M_node = (Pos._M_node)->_M_next;
          std::__cxx11::string::string((string *)&local_d0,"_ToIvec",(allocator *)&local_260);
          std::__cxx11::string::string((string *)&local_f0," ",&local_2c9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    ((HLSLTokenInfo *)&err,Identifier,&local_d0,&local_f0,0xffffffffffffffff);
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>(local_2c8,cVar2,(HLSLTokenInfo *)&err);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::string((string *)&local_110,"(",(allocator *)&local_260);
          std::__cxx11::string::string((string *)&local_130,"",&local_2c9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    ((HLSLTokenInfo *)&err,OpenParen,&local_110,&local_130,0xffffffffffffffff);
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>(local_2c8,cVar2,(HLSLTokenInfo *)&err);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::string((string *)&local_150,")",(allocator *)&local_260);
          std::__cxx11::string::string((string *)&local_170,"",&local_2c9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    ((HLSLTokenInfo *)&err,ClosingParen,&local_150,&local_170,0xffffffffffffffff);
          cVar3._M_node = local_2c0._M_node;
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>(local_2c8,local_2c0,(HLSLTokenInfo *)&err);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::assign((char *)&cVar3._M_node[3]._M_prev);
          *(undefined4 *)&cVar3._M_node[1]._M_next = 0x13f;
          std::__cxx11::string::assign((char *)&cVar3._M_node[1]._M_prev);
          std::__cxx11::string::assign((char *)&__position._M_node[3]._M_prev);
          *(undefined4 *)&__position._M_node[1]._M_next = 0x135;
          std::__cxx11::string::assign((char *)&__position._M_node[1]._M_prev);
          std::__cxx11::string::string((string *)&local_190,"_ExpandVector",(allocator *)&local_260)
          ;
          std::__cxx11::string::string((string *)&local_1b0," ",&local_2c9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    ((HLSLTokenInfo *)&err,Identifier,&local_190,&local_1b0,0xffffffffffffffff);
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>(local_2c8,__position,(HLSLTokenInfo *)&err);
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::string((string *)&local_1d0,")",(allocator *)&local_260);
          std::__cxx11::string::string((string *)&local_1f0,"",&local_2c9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    ((HLSLTokenInfo *)&err,ClosingParen,&local_1d0,&local_1f0,0xffffffffffffffff);
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>(local_2c8,__position_00,(HLSLTokenInfo *)&err)
          ;
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::string((string *)&local_210,")",(allocator *)&local_260);
          std::__cxx11::string::string((string *)&local_230,"",&local_2c9);
          Parsing::HLSLTokenInfo::HLSLTokenInfo
                    ((HLSLTokenInfo *)&err,ClosingParen,&local_210,&local_230,0xffffffffffffffff);
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::emplace<Diligent::Parsing::HLSLTokenInfo>(local_2c8,__position_00,(HLSLTokenInfo *)&err)
          ;
          Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_210);
          piVar4->_M_node = cVar2._M_node;
          return true;
        }
      }
      return false;
    }
    Pos._M_node = (Pos._M_node)->_M_next;
    if (Pos._M_node == p_Var1) {
      return false;
    }
    if (*(int *)&Pos._M_node[1]._M_next != 0x137) break;
    err._M_dataplus._M_p =
         (pointer)(local_2c8->
                  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
    _Var5 = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&err,ScopeEnd,Pos);
    if (local_2b8->_M_node == ScopeEnd->_M_node) {
      FormatString<char[48]>(&err,(char (*) [48])"Unable to find matching closing square bracket.");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_260,local_240,local_2b8,4);
      Args_1 = (char (*) [60])0x7bc;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessRWTextureStore",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x7bc,&err,(char (*) [2])0x2c8293,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&err);
    }
    if (*(int *)&_Var5._M_node[1]._M_next != 0x138) {
      FormatString<char[26],char[60]>
                (&err,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"ClosingStapleToken->Type == TokenType::ClosingSquareBracket",Args_1
                );
      Args_1 = (char (*) [60])0x7c1;
      DebugAssertionFailed
                (err._M_dataplus._M_p,"ProcessRWTextureStore",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x7c1);
      std::__cxx11::string::~string((string *)&err);
    }
    if (uVar6 < (uint)local_238) {
      Pos = _Var5;
    }
    uVar6 = uVar6 + 1;
  }
  return false;
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureStore(TokenListType::iterator&       Token,
                                                                     const TokenListType::iterator& ScopeEnd,
                                                                     Uint32                         ArrayDim)
{
    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    // ^

    // Find the last pair of square brackets, skipping texture array indexing
    auto OpenStapleToken    = Token;
    auto ClosingStapleToken = ScopeEnd;
    for (Uint32 ArrayIdx = 0; ArrayIdx < ArrayDim + 1; ++ArrayIdx)
    {
        ++OpenStapleToken;
        if (OpenStapleToken == ScopeEnd || OpenStapleToken->Type != TokenType::OpenSquareBracket)
            return false;

        ClosingStapleToken = Parsing::FindMatchingBracket(m_Tokens.begin(), ScopeEnd, OpenStapleToken);
        VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching closing square bracket.");

        // RWTex[Location[idx].xy]
        //                       ^
        //              ClosingStapleToken
        VERIFY_EXPR(ClosingStapleToken->Type == TokenType::ClosingSquareBracket);

        if (ArrayIdx < ArrayDim)
        {
            OpenStapleToken = ClosingStapleToken;
            // RWTexArray[idx[0]][Location.xy]
            //                  ^
            //            OpenStapleToken
        }
    }
    //      RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //           ^           ^
    //  OpenStaplePos     ClosingStaplePos

    auto AssignmentToken = ClosingStapleToken;
    ++AssignmentToken;

    if (AssignmentToken == ScopeEnd || AssignmentToken->Type != TokenType::Assignment)
    {
        // The function is called for ALL RW texture objects found, so this may not be
        // the store operation, but something else (for instance:
        // InterlockedExchange(Tex2D_I1[GTid.xy], 1, iOldVal) )
        return false;
    }

    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                    ^
    //              AssignmentToken

    auto SemicolonToken = AssignmentToken;
    while (SemicolonToken != ScopeEnd && SemicolonToken->Type != TokenType::Semicolon)
        ++SemicolonToken;
    if (SemicolonToken == ScopeEnd)
        return false;
    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    // ^                                              ^
    // Token                                    SemicolonToken

    m_Tokens.insert(Token, TokenInfo(TokenType::Identifier, "imageStore", Token->Delimiter.c_str()));
    m_Tokens.insert(Token, TokenInfo(TokenType::OpenParen, "(", ""));
    Token->Delimiter = " ";
    // imageStore( RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //             ^    ^
    //          Token  OpenStapleToken

    OpenStapleToken->Delimiter = "";
    OpenStapleToken->Type      = TokenType::Comma;
    OpenStapleToken->Literal   = ",";
    // imageStore( RWTex,Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                  ^           ^
    //      OpenStapleToken     ClosingStapleToken

    auto LocationToken = OpenStapleToken;
    ++LocationToken;
    m_Tokens.insert(LocationToken, TokenInfo(TokenType::Identifier, "_ToIvec", " "));
    m_Tokens.insert(LocationToken, TokenInfo(TokenType::OpenParen, "(", ""));
    // imageStore( RWTex, _ToIvec(Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                            ^          ^
    //                  LocationToken     ClosingStapleToken

    m_Tokens.insert(ClosingStapleToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex, _ToIvec(Location.xy)] = float4(0.0, 0.0, 0.0, 1.0);
    //                                        ^
    //                                ClosingStapleToken

    ClosingStapleToken->Delimiter = "";
    ClosingStapleToken->Type      = TokenType::Comma;
    ClosingStapleToken->Literal   = ",";
    // imageStore( RWTex, _ToIvec(Location.xy), = float4(0.0, 0.0, 0.0, 1.0);
    //                                          ^
    //                                   AssignmentToken

    AssignmentToken->Delimiter = "";
    AssignmentToken->Type      = TokenType::OpenParen;
    AssignmentToken->Literal   = "(";
    // imageStore( RWTex, _ToIvec(Location.xy),( float4(0.0, 0.0, 0.0, 1.0);
    //                                         ^
    //                                   AssignmentToken

    m_Tokens.insert(AssignmentToken, TokenInfo(TokenType::Identifier, "_ExpandVector", " "));
    // imageStore( RWTex, _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0);
    //                                                       ^                           ^
    //                                                AssignmentToken               SemicolonToken

    // Insert closing bracket for _ExpandVector
    m_Tokens.insert(SemicolonToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0));
    //                                                                                     ^
    //                                                                              SemicolonToken

    // Insert closing bracket for imageStore
    m_Tokens.insert(SemicolonToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0)));
    //                                                                                      ^
    //                                                                               SemicolonToken

    Token = LocationToken;
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0)));
    //                             ^

    // Note that 'Location' may require further processing as it itself may be e.g. image load operation

    return true;
}